

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGla.c
# Opt level: O0

void Ga2_ManReportMemory(Ga2_Man_t *p)

{
  int iVar1;
  long lVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  undefined1 auVar16 [16];
  double local_d8;
  double local_c8;
  double local_b8;
  double local_a8;
  double local_98;
  double local_88;
  double local_78;
  double local_68;
  double memOth;
  double memHash;
  double memRef;
  double memMap;
  double memPro;
  double memSat;
  double memAig;
  double memTot;
  Ga2_Man_t *p_local;
  
  iVar1 = p->pGia->nObjsAlloc;
  dVar3 = Vec_IntMemory(p->pGia->vMapping);
  dVar3 = (double)iVar1 * 12.0 + dVar3;
  dVar4 = sat_solver2_memory(p->pSat,1);
  dVar5 = sat_solver2_memory_proof(p->pSat);
  dVar6 = Vec_VecMemoryInt((Vec_Vec_t *)p->vId2Lit);
  dVar7 = Rnm_ManMemoryUsage(p->pRnm);
  lVar2 = (long)p->nTable * 0x18;
  auVar16._8_4_ = (int)((ulong)lVar2 >> 0x20);
  auVar16._0_8_ = lVar2;
  auVar16._12_4_ = 0x45300000;
  dVar8 = (auVar16._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)lVar2) - 4503599627370496.0);
  dVar9 = Vec_VecMemoryInt((Vec_Vec_t *)p->vCnfs);
  dVar10 = Vec_IntMemory(p->vIds);
  dVar11 = Vec_IntMemory(p->vProofIds);
  dVar12 = Vec_IntMemory(p->vAbs);
  dVar13 = Vec_IntMemory(p->vValues);
  dVar14 = Vec_IntMemory(p->vLits);
  dVar15 = Vec_IntMemory(p->vIsopMem);
  dVar9 = dVar15 + dVar14 + dVar13 + dVar12 + dVar11 + dVar10 + dVar9 + 224.0 + 926274.0;
  dVar10 = dVar3 + dVar4 + dVar5 + dVar6 + dVar7 + dVar8 + dVar9;
  Abc_Print(1,"%s =","Memory: AIG      ");
  if ((dVar10 != 0.0) || (NAN(dVar10))) {
    local_68 = (dVar3 * 100.0) / dVar10;
  }
  else {
    local_68 = 0.0;
  }
  Abc_Print(1,"%10.3f MB (%6.2f %%)\n",(dVar3 * 1.0) / 1048576.0,local_68);
  Abc_Print(1,"%s =","Memory: SAT      ");
  if ((dVar10 != 0.0) || (NAN(dVar10))) {
    local_78 = (dVar4 * 100.0) / dVar10;
  }
  else {
    local_78 = 0.0;
  }
  Abc_Print(1,"%10.3f MB (%6.2f %%)\n",(dVar4 * 1.0) / 1048576.0,local_78);
  Abc_Print(1,"%s =","Memory: Proof    ");
  if ((dVar10 != 0.0) || (NAN(dVar10))) {
    local_88 = (dVar5 * 100.0) / dVar10;
  }
  else {
    local_88 = 0.0;
  }
  Abc_Print(1,"%10.3f MB (%6.2f %%)\n",(dVar5 * 1.0) / 1048576.0,local_88);
  Abc_Print(1,"%s =","Memory: Map      ");
  if ((dVar10 != 0.0) || (NAN(dVar10))) {
    local_98 = (dVar6 * 100.0) / dVar10;
  }
  else {
    local_98 = 0.0;
  }
  Abc_Print(1,"%10.3f MB (%6.2f %%)\n",(dVar6 * 1.0) / 1048576.0,local_98);
  Abc_Print(1,"%s =","Memory: Refine   ");
  if ((dVar10 != 0.0) || (NAN(dVar10))) {
    local_a8 = (dVar7 * 100.0) / dVar10;
  }
  else {
    local_a8 = 0.0;
  }
  Abc_Print(1,"%10.3f MB (%6.2f %%)\n",(dVar7 * 1.0) / 1048576.0,local_a8);
  Abc_Print(1,"%s =","Memory: Hash     ");
  if ((dVar10 != 0.0) || (NAN(dVar10))) {
    local_b8 = (dVar8 * 100.0) / dVar10;
  }
  else {
    local_b8 = 0.0;
  }
  Abc_Print(1,"%10.3f MB (%6.2f %%)\n",(dVar8 * 1.0) / 1048576.0,local_b8);
  Abc_Print(1,"%s =","Memory: Other    ");
  if ((dVar10 != 0.0) || (NAN(dVar10))) {
    local_c8 = (dVar9 * 100.0) / dVar10;
  }
  else {
    local_c8 = 0.0;
  }
  Abc_Print(1,"%10.3f MB (%6.2f %%)\n",(dVar9 * 1.0) / 1048576.0,local_c8);
  Abc_Print(1,"%s =","Memory: TOTAL    ");
  if ((dVar10 != 0.0) || (NAN(dVar10))) {
    local_d8 = (dVar10 * 100.0) / dVar10;
  }
  else {
    local_d8 = 0.0;
  }
  Abc_Print(1,"%10.3f MB (%6.2f %%)\n",(dVar10 * 1.0) / 1048576.0,local_d8);
  return;
}

Assistant:

void Ga2_ManReportMemory( Ga2_Man_t * p )
{
    double memTot = 0;
    double memAig = 1.0 * p->pGia->nObjsAlloc * sizeof(Gia_Obj_t) + Vec_IntMemory(p->pGia->vMapping);
    double memSat = sat_solver2_memory( p->pSat, 1 );
    double memPro = sat_solver2_memory_proof( p->pSat );
    double memMap = Vec_VecMemoryInt( (Vec_Vec_t *)p->vId2Lit );
    double memRef = Rnm_ManMemoryUsage( p->pRnm );
    double memHash= sizeof(int) * 6 * p->nTable;
    double memOth = sizeof(Ga2_Man_t);
    memOth += Vec_VecMemoryInt( (Vec_Vec_t *)p->vCnfs );
    memOth += Vec_IntMemory( p->vIds );
    memOth += Vec_IntMemory( p->vProofIds );
    memOth += Vec_IntMemory( p->vAbs );
    memOth += Vec_IntMemory( p->vValues );
    memOth += Vec_IntMemory( p->vLits );
    memOth += Vec_IntMemory( p->vIsopMem );
    memOth += 336450 + (sizeof(char) + sizeof(char*)) * 65536;
    memTot = memAig + memSat + memPro + memMap + memRef + memHash + memOth;
    ABC_PRMP( "Memory: AIG      ", memAig, memTot );
    ABC_PRMP( "Memory: SAT      ", memSat, memTot );
    ABC_PRMP( "Memory: Proof    ", memPro, memTot );
    ABC_PRMP( "Memory: Map      ", memMap, memTot );
    ABC_PRMP( "Memory: Refine   ", memRef, memTot );
    ABC_PRMP( "Memory: Hash     ", memHash,memTot );
    ABC_PRMP( "Memory: Other    ", memOth, memTot );
    ABC_PRMP( "Memory: TOTAL    ", memTot, memTot );
}